

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

void server_poll_cb(uv_poll_t *handle,int status,int events)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  connection_context_t *pcVar5;
  void *pvVar6;
  ssize_t sVar7;
  ulong uVar8;
  int *piVar9;
  uint extraout_EDX;
  size_t sVar10;
  uint uVar11;
  sockaddr *__addr;
  void *pvVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  undefined8 *__ptr;
  socklen_t addr_len;
  sockaddr_in addr;
  socklen_t local_1c;
  sockaddr local_18;
  
  pvVar6 = handle->data;
  local_1c = 0x10;
  pcVar5 = (connection_context_t *)(ulong)*(uint *)((long)pvVar6 + 0xa0);
  __addr = &local_18;
  iVar2 = accept(*(uint *)((long)pvVar6 + 0xa0),__addr,&local_1c);
  iVar3 = (int)__addr;
  if (iVar2 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    pcVar5 = create_connection_context(iVar2,1);
    pcVar5->events = 7;
    iVar3 = 7;
    iVar2 = uv_poll_start(pcVar5,7,connection_poll_cb);
    if (iVar2 == 0) {
      iVar2 = *(int *)((long)pvVar6 + 0xa4) + 1;
      *(int *)((long)pvVar6 + 0xa4) = iVar2;
      if (iVar2 == 5) {
        close_socket(*(uv_os_sock_t *)((long)pvVar6 + 0xa0));
        uv_close(pvVar6,server_close_cb);
      }
      return;
    }
  }
  server_poll_cb_cold_2();
  plVar13 = (long *)0x170;
  iVar2 = iVar3;
  pvVar6 = malloc(0x170);
  if (pvVar6 == (void *)0x0) {
    create_connection_context_cold_3();
LAB_00167b78:
    create_connection_context_cold_1();
  }
  else {
    *(int *)((long)pvVar6 + 0x138) = (int)pcVar5;
    *(int *)((long)pvVar6 + 0x150) = iVar3;
    *(undefined8 *)((long)pvVar6 + 0x140) = 0;
    *(undefined8 *)((long)pvVar6 + 0x148) = 0;
    *(undefined8 *)((long)pvVar6 + 0x154) = 0;
    *(undefined8 *)((long)pvVar6 + 0x15c) = 0;
    *(undefined8 *)((long)pvVar6 + 0x164) = 0;
    plVar13 = (long *)uv_default_loop();
    pvVar12 = pvVar6;
    iVar3 = uv_poll_init_socket(plVar13,pvVar6,(ulong)pcVar5 & 0xffffffff);
    iVar2 = (int)pvVar12;
    *(int *)((long)pvVar6 + 0x154) = *(int *)((long)pvVar6 + 0x154) + 1;
    *(void **)pvVar6 = pvVar6;
    if (iVar3 != 0) goto LAB_00167b78;
    plVar13 = (long *)uv_default_loop();
    iVar2 = (int)pvVar6 + 0xa0;
    iVar3 = uv_timer_init();
    *(int *)((long)pvVar6 + 0x154) = *(int *)((long)pvVar6 + 0x154) + 1;
    *(void **)((long)pvVar6 + 0xa0) = pvVar6;
    if (iVar3 == 0) {
      return;
    }
  }
  create_connection_context_cold_2();
  plVar14 = plVar13;
  if (iVar2 == 0) {
    plVar1 = (long *)*plVar13;
    uVar11 = *(uint *)((long)plVar1 + 0x164);
    if ((uVar11 & extraout_EDX) == 0) goto LAB_00168090;
    if ((~uVar11 & extraout_EDX) != 0) goto LAB_00168095;
    if ((extraout_EDX & 1) == 0) goto switchD_00167c05_caseD_4;
    iVar2 = rand();
    switch(iVar2 % 7) {
    case 0:
    case 1:
      plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
      sVar7 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer,0x4a,0);
      uVar4 = (uint)sVar7;
      if (-1 < (int)uVar4) {
        if (uVar4 == 0) goto LAB_00167caa;
        plVar1[0x28] = plVar1[0x28] + (ulong)(uVar4 & 0x7fffffff);
        break;
      }
      goto LAB_001680a4;
    case 2:
    case 3:
      plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
      uVar8 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar8) {
        if ((int)uVar8 != 0) {
          do {
            plVar1[0x28] = plVar1[0x28] + (uVar8 & 0xffffffff);
            plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
            uVar8 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar8);
          if ((int)uVar8 != 0) {
            piVar9 = __errno_location();
            if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_00167caa:
        *(undefined4 *)(plVar1 + 0x2b) = 1;
        uVar11 = uVar11 & 0xfffffffe;
        break;
      }
      goto LAB_001680a9;
    case 4:
      break;
    case 5:
      uVar11 = uVar11 & 0xfffffffe;
      plVar14 = plVar1 + 0x14;
      plVar15 = plVar14;
      iVar2 = uv_is_active();
      if (iVar2 == 0) {
        *(undefined4 *)(plVar1 + 0x2d) = 1;
        uv_timer_start(plVar14,delay_timer_cb,10,0);
      }
      else {
        *(byte *)(plVar1 + 0x2d) = *(byte *)(plVar1 + 0x2d) | 1;
        plVar14 = plVar15;
      }
      break;
    case 6:
      uv_poll_start(plVar1,2,connection_poll_cb);
      plVar14 = plVar1;
      uv_poll_start(plVar1,1,connection_poll_cb);
      *(undefined4 *)((long)plVar1 + 0x164) = 1;
      break;
    default:
      goto switchD_00167c05_default;
    }
switchD_00167c05_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_00167e8c_caseD_4;
    if (((ulong)plVar1[0x29] < 0x10000) && ((test_mode != '\x01' || (*(int *)(plVar1 + 0x2a) == 0)))
       ) {
      iVar2 = rand();
      switch(iVar2 % 7) {
      case 0:
      case 1:
        if (plVar1[0x29] == 0x10000) goto LAB_001680b3;
        uVar8 = 0x10000 - plVar1[0x29];
        sVar10 = 0x67;
        if (uVar8 < 0x67) {
          sVar10 = uVar8;
        }
        plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
        sVar7 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_2,sVar10,0);
        uVar4 = (uint)sVar7;
        if ((int)uVar4 < 0) {
          piVar9 = __errno_location();
          if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_00168027;
          }
LAB_0016803c:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar4 != 0) {
          plVar1[0x29] = plVar1[0x29] + (ulong)(uVar4 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_001680bd;
      case 2:
      case 3:
        if (plVar1[0x29] == 0x10000) goto LAB_001680b8;
        sVar10 = 0x10000 - plVar1[0x29];
        if (0x4d1 < sVar10) {
          sVar10 = 0x4d2;
        }
        plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
        sVar7 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_3,sVar10,0);
        uVar4 = (uint)sVar7;
        if (-1 < (int)uVar4) {
          if (uVar4 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar8 = (ulong)(uVar4 & 0x7fffffff) + plVar1[0x29];
            plVar1[0x29] = uVar8;
            while (uVar8 < 0x10000) {
              sVar10 = 0x10000 - uVar8;
              if (uVar8 < 0xfb2f) {
                sVar10 = 0x4d2;
              }
              plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
              sVar7 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_3,sVar10,0);
              if ((int)(uint)sVar7 < 1) {
                piVar9 = __errno_location();
                if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_0016808b;
                }
                break;
              }
              uVar8 = (ulong)((uint)sVar7 & 0x7fffffff) + plVar1[0x29];
              plVar1[0x29] = uVar8;
            }
            break;
          }
          goto LAB_001680c2;
        }
LAB_00168027:
        piVar9 = __errno_location();
        if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto LAB_0016803c;
        goto LAB_001680cc;
      case 4:
        break;
      case 5:
        uVar11 = uVar11 & 0xfffffffd;
        iVar2 = uv_is_active(plVar1 + 0x14);
        if (iVar2 == 0) {
          *(undefined4 *)(plVar1 + 0x2d) = 2;
          uv_timer_start(plVar1 + 0x14,delay_timer_cb,100,0);
        }
        else {
          *(byte *)(plVar1 + 0x2d) = *(byte *)(plVar1 + 0x2d) | 2;
        }
        break;
      case 6:
        uv_poll_start(plVar1,1,connection_poll_cb);
        uv_poll_start(plVar1,2,connection_poll_cb);
        *(undefined4 *)((long)plVar1 + 0x164) = 2;
        break;
      default:
        goto switchD_00167e8c_default;
      }
switchD_00167e8c_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(plVar1 + 0x2c) = 1;
        disconnects = disconnects + 1;
        uVar11 = uVar11 & 0xfffffffb;
      }
      if (((*(int *)(plVar1 + 0x2b) == 0) || (*(int *)((long)plVar1 + 0x15c) == 0)) ||
         (*(int *)(plVar1 + 0x2c) == 0)) {
        if (uVar11 != *(uint *)((long)plVar1 + 0x164)) {
          *(uint *)((long)plVar1 + 0x164) = uVar11;
          uv_poll_start(plVar13,uVar11,connection_poll_cb);
        }
      }
      else {
        close_socket(*(uv_os_sock_t *)(plVar1 + 0x27));
        uv_close(plVar1,connection_close_cb);
        uv_close(plVar1 + 0x14,connection_close_cb);
        *(undefined4 *)((long)plVar1 + 0x164) = 0;
      }
      iVar2 = *(int *)((long)plVar1 + 0x164);
      iVar3 = uv_is_active();
      if (iVar2 != 0) {
        if (iVar3 == 1) {
          return;
        }
        connection_poll_cb_cold_16();
        iVar3 = extraout_EAX;
      }
      if (iVar3 == 0) {
        return;
      }
      goto LAB_0016809a;
    }
    plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
    iVar2 = shutdown(*(uint *)(plVar1 + 0x27),1);
    if (iVar2 == 0) {
      *(undefined4 *)((long)plVar1 + 0x15c) = 1;
      uVar11 = uVar11 & 0xfffffffd;
      goto switchD_00167e8c_caseD_4;
    }
  }
  else {
LAB_0016808b:
    connection_poll_cb_cold_1();
    plVar13 = plVar14;
LAB_00168090:
    connection_poll_cb_cold_18();
LAB_00168095:
    connection_poll_cb_cold_2();
LAB_0016809a:
    connection_poll_cb_cold_17();
    plVar14 = plVar13;
  }
  connection_poll_cb_cold_7();
LAB_001680a4:
  connection_poll_cb_cold_5();
LAB_001680a9:
  connection_poll_cb_cold_3();
switchD_00167c05_default:
  connection_poll_cb_cold_6();
LAB_001680b3:
  connection_poll_cb_cold_14();
LAB_001680b8:
  connection_poll_cb_cold_11();
LAB_001680bd:
  connection_poll_cb_cold_12();
LAB_001680c2:
  connection_poll_cb_cold_9();
switchD_00167e8c_default:
  connection_poll_cb_cold_15();
LAB_001680cc:
  connection_poll_cb_cold_10();
  iVar2 = close((int)plVar14);
  if ((iVar2 == 0) || (piVar9 = __errno_location(), *piVar9 == 0x68)) {
    return;
  }
  close_socket_cold_1();
  plVar13 = (long *)*plVar14;
  iVar2 = uv_is_active();
  if (iVar2 == 0) {
    if (*(uint *)(plVar13 + 0x2d) == 0) goto LAB_00168133;
    uVar11 = *(uint *)(plVar13 + 0x2d) | *(uint *)((long)plVar13 + 0x164);
    *(uint *)((long)plVar13 + 0x164) = uVar11;
    *(undefined4 *)(plVar13 + 0x2d) = 0;
    iVar2 = uv_poll_start(plVar13,uVar11,connection_poll_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00168133:
    plVar13 = plVar14;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)*plVar13;
  piVar9 = (int *)((long)__ptr + 0x154);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return;
  }
  if ((test_mode == '\x01') && (*(int *)(__ptr + 0x2a) == 0)) {
    if (__ptr[0x28] != 0) {
      connection_close_cb_cold_2();
LAB_001681af:
      connection_close_cb_cold_1();
      goto LAB_001681b4;
    }
  }
  else if (__ptr[0x28] != 0x10000) goto LAB_001681af;
  if ((test_mode != '\0') && (*(int *)(__ptr + 0x2a) != 0)) {
    if (__ptr[0x29] == 0) goto LAB_00168194;
    connection_close_cb_cold_3();
  }
  if (__ptr[0x29] != 0x10000) {
LAB_001681b4:
    connection_close_cb_cold_4();
    free((void *)*__ptr);
    return;
  }
LAB_00168194:
  closed_connections = closed_connections + 1;
  free(__ptr);
  return;
}

Assistant:

static void server_poll_cb(uv_poll_t* handle, int status, int events) {
  server_context_t* server_context = (server_context_t*)
                                          handle->data;
  connection_context_t* connection_context;
  struct sockaddr_in addr;
  socklen_t addr_len;
  uv_os_sock_t sock;
  int r;

  addr_len = sizeof addr;
  sock = accept(server_context->sock, (struct sockaddr*) &addr, &addr_len);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

  connection_context = create_connection_context(sock, 1);
  connection_context->events = UV_READABLE | UV_WRITABLE | UV_DISCONNECT;
  r = uv_poll_start(&connection_context->poll_handle,
                    UV_READABLE | UV_WRITABLE | UV_DISCONNECT,
                    connection_poll_cb);
  ASSERT(r == 0);

  if (++server_context->connections == NUM_CLIENTS) {
    close_socket(server_context->sock);
    destroy_server_context(server_context);
  }
}